

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

void __thiscall Matrix3f::setCol(Matrix3f *this,int j,Vector3f *v)

{
  long lVar1;
  float fVar2;
  
  fVar2 = Vector3f::x(v);
  lVar1 = (long)(j * 3);
  this->m_elements[lVar1] = fVar2;
  fVar2 = Vector3f::y(v);
  this->m_elements[lVar1 + 1] = fVar2;
  fVar2 = Vector3f::z(v);
  this->m_elements[lVar1 + 2] = fVar2;
  return;
}

Assistant:

void Matrix3f::setCol( int j, const Vector3f& v )
{
	int colStart = 3 * j;

	m_elements[ colStart ] = v.x();
	m_elements[ colStart + 1 ] = v.y();
	m_elements[ colStart + 2 ] = v.z();
}